

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void __thiscall
Test_Template_RegisterString::Test_Template_RegisterString(Test_Template_RegisterString *this)

{
  value_type local_18;
  Test_Template_RegisterString *local_10;
  Test_Template_RegisterString *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(Template, RegisterString) {
  ASSERT(Template::StringToTemplateCache("file1", "Some text"));
  Template* tpl = Template::GetTemplate("file1", STRIP_WHITESPACE);
  ASSERT(tpl);
  ASSERT(Template::GetTemplate("file1", STRIP_WHITESPACE) == tpl);

  ASSERT(Template::StringToTemplateCache("file2", "Top {{>INC}}"));

  TemplateDictionary dict("dict");
  string expected = "Some text";
  AssertExpandIs(tpl, &dict, expected, true);

  TemplateDictionary* sub_dict = dict.AddIncludeDictionary("INC");
  sub_dict->SetFilename("file1");
  tpl = Template::GetTemplate("file2", STRIP_WHITESPACE);
  expected = "Top Some text";
  AssertExpandIs(tpl, &dict, expected, true);
}